

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O3

long __thiscall FileReaderZ::Read(FileReaderZ *this,void *buffer,long len)

{
  uint uVar1;
  uInt uVar2;
  undefined4 extraout_var;
  ulong uVar3;
  
  (this->Stream).next_out = (Bytef *)buffer;
  (this->Stream).avail_out = (uInt)len;
  do {
    uVar1 = inflate(&this->Stream,2);
    if (((this->Stream).avail_in == 0) && (this->SawEOF == false)) {
      uVar2 = (*(this->File->super_FileReaderBase)._vptr_FileReaderBase[2])
                        (this->File,this->InBuff,0x1000);
      if (CONCAT44(extraout_var,uVar2) < 0x1000) {
        this->SawEOF = true;
      }
      (this->Stream).next_in = this->InBuff;
      (this->Stream).avail_in = uVar2;
    }
    uVar2 = (this->Stream).avail_out;
  } while ((uVar1 == 0) && (uVar2 != 0));
  if (1 < uVar1) {
    I_Error("Corrupt zlib stream");
    uVar2 = (this->Stream).avail_out;
  }
  if (uVar2 == 0) {
    uVar3 = 0;
  }
  else {
    I_Error("Ran out of data in zlib stream");
    uVar3 = (ulong)(this->Stream).avail_out;
  }
  return len - uVar3;
}

Assistant:

long FileReaderZ::Read (void *buffer, long len)
{
	int err;

	Stream.next_out = (Bytef *)buffer;
	Stream.avail_out = len;

	do
	{
		err = inflate (&Stream, Z_SYNC_FLUSH);
		if (Stream.avail_in == 0 && !SawEOF)
		{
			FillBuffer ();
		}
	} while (err == Z_OK && Stream.avail_out != 0);

	if (err != Z_OK && err != Z_STREAM_END)
	{
		I_Error ("Corrupt zlib stream");
	}

	if (Stream.avail_out != 0)
	{
		I_Error ("Ran out of data in zlib stream");
	}

	return len - Stream.avail_out;
}